

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseReactionTaskFunction::MarkVisitKindSpecificPtrs
          (JavascriptPromiseReactionTaskFunction *this,SnapshotExtractor *extractor)

{
  void **ppvVar1;
  JavascriptPromiseReaction **ppJVar2;
  JavascriptPromiseReaction *this_00;
  SnapshotExtractor *extractor_local;
  JavascriptPromiseReactionTaskFunction *this_local;
  
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument);
  if (*ppvVar1 != (void *)0x0) {
    ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptPromiseReaction__
                        ((WriteBarrierPtr *)&this->reaction);
    if (*ppJVar2 != (JavascriptPromiseReaction *)0x0) {
      ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->argument)
      ;
      TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar1);
      this_00 = Memory::WriteBarrierPtr<Js::JavascriptPromiseReaction>::operator->(&this->reaction);
      JavascriptPromiseReaction::MarkVisitPtrs(this_00,extractor);
      return;
    }
  }
  TTDAbort_unrecoverable_error("Was not expecting this!!!");
}

Assistant:

void JavascriptPromiseReactionTaskFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->argument != nullptr && this->reaction != nullptr, "Was not expecting this!!!");

        extractor->MarkVisitVar(this->argument);

        this->reaction->MarkVisitPtrs(extractor);
    }